

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void highbd_filter4_dual_sse2
               (__m128i *p,__m128i *q,__m128i *ps,__m128i *qs,__m128i *mask,__m128i *th,int bd,
               __m128i *t80)

{
  __m128i alVar1;
  __m128i alVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar24 [16];
  short sVar25;
  short sVar26;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar27 [16];
  short sVar34;
  short sVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  ushort uVar42;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  undefined1 auVar43 [16];
  ushort uVar50;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar51;
  
  alVar41 = *t80;
  alVar1 = *p;
  alVar2 = p[1];
  auVar24 = psubsw((undefined1  [16])alVar1,(undefined1  [16])alVar41);
  auVar54 = psubusw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  auVar52 = psubusw((undefined1  [16])alVar1,(undefined1  [16])alVar2);
  auVar36 = psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar41);
  alVar1 = *q;
  alVar2 = q[1];
  auVar40 = psubsw((undefined1  [16])alVar1,(undefined1  [16])alVar41);
  auVar55 = psubusw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  auVar27 = psubusw((undefined1  [16])alVar1,(undefined1  [16])alVar2);
  auVar38 = psllw(_DAT_004651e0,ZEXT416((uint)bd));
  auVar37 = psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar41);
  auVar39._8_2_ = 0xffff;
  auVar39._0_8_ = 0xffffffffffffffff;
  auVar39._10_2_ = 0xffff;
  auVar39._12_2_ = 0xffff;
  auVar39._14_2_ = 0xffff;
  auVar39 = paddsw(auVar38,auVar39);
  auVar39 = psubsw(auVar39,(undefined1  [16])alVar41);
  auVar38 = psubsw((undefined1  [16])0x0,(undefined1  [16])alVar41);
  auVar43 = psubsw(auVar36,auVar37);
  sVar16 = auVar39._0_2_;
  sVar26 = auVar43._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar17 = auVar39._2_2_;
  sVar26 = auVar43._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar18 = auVar39._4_2_;
  sVar26 = auVar43._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar19 = auVar39._6_2_;
  sVar26 = auVar43._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar20 = auVar39._8_2_;
  sVar26 = auVar43._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar21 = auVar39._10_2_;
  sVar26 = auVar43._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar22 = auVar39._12_2_;
  sVar26 = auVar43._12_2_;
  sVar51 = auVar43._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  sVar23 = auVar39._14_2_;
  uVar50 = (ushort)(sVar23 < sVar51) * sVar23 | (ushort)(sVar23 >= sVar51) * sVar51;
  auVar52 = auVar52 | auVar54;
  auVar27 = auVar27 | auVar55;
  sVar26 = auVar52._0_2_;
  sVar25 = auVar27._0_2_;
  sVar35 = auVar52._2_2_;
  sVar28 = auVar27._2_2_;
  sVar4 = auVar52._4_2_;
  sVar29 = auVar27._4_2_;
  sVar6 = auVar52._6_2_;
  sVar30 = auVar27._6_2_;
  sVar8 = auVar52._8_2_;
  sVar31 = auVar27._8_2_;
  sVar10 = auVar52._10_2_;
  sVar32 = auVar27._10_2_;
  sVar12 = auVar52._12_2_;
  sVar33 = auVar27._12_2_;
  sVar34 = auVar27._14_2_;
  sVar14 = auVar52._14_2_;
  sVar51 = auVar38._0_2_;
  auVar43._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  sVar3 = auVar38._2_2_;
  auVar43._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  sVar5 = auVar38._4_2_;
  auVar43._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  sVar7 = auVar38._6_2_;
  auVar43._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  sVar9 = auVar38._8_2_;
  auVar43._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  sVar11 = auVar38._10_2_;
  auVar43._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  sVar13 = auVar38._12_2_;
  auVar43._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  sVar15 = auVar38._14_2_;
  auVar43._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  auVar27._0_2_ =
       -(ushort)((short)((ushort)(*th)[0] ^ 0x8000) <
                (short)(((ushort)(sVar25 < sVar26) * sVar26 | (ushort)(sVar25 >= sVar26) * sVar25) ^
                       0x8000));
  auVar27._2_2_ =
       -(ushort)((short)(*(ushort *)((long)*th + 2) ^ 0x8000) <
                (short)(((ushort)(sVar28 < sVar35) * sVar35 | (ushort)(sVar28 >= sVar35) * sVar28) ^
                       0x8000));
  auVar27._4_2_ =
       -(ushort)((short)(*(ushort *)((long)*th + 4) ^ 0x8000) <
                (short)(((ushort)(sVar29 < sVar4) * sVar4 | (ushort)(sVar29 >= sVar4) * sVar29) ^
                       0x8000));
  auVar27._6_2_ =
       -(ushort)((short)(*(ushort *)((long)*th + 6) ^ 0x8000) <
                (short)(((ushort)(sVar30 < sVar6) * sVar6 | (ushort)(sVar30 >= sVar6) * sVar30) ^
                       0x8000));
  auVar27._8_2_ =
       -(ushort)((short)((ushort)(*th)[1] ^ 0x8000) <
                (short)(((ushort)(sVar31 < sVar8) * sVar8 | (ushort)(sVar31 >= sVar8) * sVar31) ^
                       0x8000));
  auVar27._10_2_ =
       -(ushort)((short)(*(ushort *)((long)*th + 10) ^ 0x8000) <
                (short)(((ushort)(sVar32 < sVar10) * sVar10 | (ushort)(sVar32 >= sVar10) * sVar32) ^
                       0x8000));
  auVar27._12_2_ =
       -(ushort)((short)(*(ushort *)((long)*th + 0xc) ^ 0x8000) <
                (short)(((ushort)(sVar33 < sVar12) * sVar12 | (ushort)(sVar33 >= sVar12) * sVar33) ^
                       0x8000));
  auVar27._14_2_ =
       -(ushort)((short)(*(ushort *)((long)*th + 0xe) ^ 0x8000) <
                (short)(((ushort)(sVar34 < sVar14) * sVar14 | (ushort)(sVar34 >= sVar14) * sVar34) ^
                       0x8000));
  auVar38 = psubsw(auVar40,auVar24);
  auVar39 = paddsw(auVar43 & auVar27,auVar38);
  auVar39 = paddsw(auVar39,auVar38);
  auVar39 = paddsw(auVar39,auVar38);
  sVar26 = auVar39._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar39._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar39._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar39._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar39._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar39._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar39._12_2_;
  sVar35 = auVar39._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar52._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar52._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar52._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar52._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar52._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar52._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar52._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar52._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  auVar38 = paddsw(_DAT_00465110,auVar52 & (undefined1  [16])*mask);
  auVar39 = paddsw(auVar52 & (undefined1  [16])*mask,_DAT_00465170);
  sVar26 = auVar38._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar38._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar38._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar38._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar38._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar38._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar38._12_2_;
  sVar35 = auVar38._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar55._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar55._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar55._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar55._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar55._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar55._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar55._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar55._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  sVar26 = auVar39._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar39._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar39._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar39._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar39._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar39._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar39._12_2_;
  sVar35 = auVar39._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar54._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar54._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar54._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar54._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar54._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar54._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar54._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar54._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  auVar52 = psraw(auVar55,3);
  auVar43 = psraw(auVar54,3);
  auVar39 = psubsw(auVar40,auVar52);
  sVar26 = auVar39._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar39._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar39._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar39._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar39._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar39._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar39._12_2_;
  sVar35 = auVar39._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar38._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar38._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar38._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar38._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar38._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar38._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar38._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar38._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  auVar39 = paddsw(auVar43,auVar24);
  sVar26 = auVar39._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar39._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar39._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar39._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar39._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar39._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar39._12_2_;
  sVar35 = auVar39._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar40._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar40._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar40._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar40._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar40._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar40._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar40._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar40._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  alVar41 = (__m128i)paddsw(auVar38,(undefined1  [16])alVar41);
  *qs = alVar41;
  alVar41 = (__m128i)paddsw(auVar40,(undefined1  [16])*t80);
  *ps = alVar41;
  auVar53._0_2_ = auVar52._0_2_ + 1;
  auVar53._2_2_ = auVar52._2_2_ + 1;
  auVar53._4_2_ = auVar52._4_2_ + 1;
  auVar53._6_2_ = auVar52._6_2_ + 1;
  auVar53._8_2_ = auVar52._8_2_ + 1;
  auVar53._10_2_ = auVar52._10_2_ + 1;
  auVar53._12_2_ = auVar52._12_2_ + 1;
  auVar53._14_2_ = auVar52._14_2_ + 1;
  auVar24 = psraw(auVar53,1);
  auVar39 = psubsw(auVar37,~auVar27 & auVar24);
  sVar26 = auVar39._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar39._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar39._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar39._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar39._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar39._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar39._12_2_;
  sVar35 = auVar39._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar37._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar37._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar37._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar37._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar37._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar37._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar37._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar37._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  auVar39 = paddsw(~auVar27 & auVar24,auVar36);
  sVar26 = auVar39._0_2_;
  uVar42 = (ushort)(sVar16 < sVar26) * sVar16 | (ushort)(sVar16 >= sVar26) * sVar26;
  sVar26 = auVar39._2_2_;
  uVar44 = (ushort)(sVar17 < sVar26) * sVar17 | (ushort)(sVar17 >= sVar26) * sVar26;
  sVar26 = auVar39._4_2_;
  uVar45 = (ushort)(sVar18 < sVar26) * sVar18 | (ushort)(sVar18 >= sVar26) * sVar26;
  sVar26 = auVar39._6_2_;
  uVar46 = (ushort)(sVar19 < sVar26) * sVar19 | (ushort)(sVar19 >= sVar26) * sVar26;
  sVar26 = auVar39._8_2_;
  uVar47 = (ushort)(sVar20 < sVar26) * sVar20 | (ushort)(sVar20 >= sVar26) * sVar26;
  sVar26 = auVar39._10_2_;
  uVar48 = (ushort)(sVar21 < sVar26) * sVar21 | (ushort)(sVar21 >= sVar26) * sVar26;
  sVar26 = auVar39._12_2_;
  sVar35 = auVar39._14_2_;
  uVar49 = (ushort)(sVar22 < sVar26) * sVar22 | (ushort)(sVar22 >= sVar26) * sVar26;
  uVar50 = (ushort)(sVar23 < sVar35) * sVar23 | (ushort)(sVar23 >= sVar35) * sVar35;
  auVar24._0_2_ = (ushort)((short)uVar42 < sVar51) * sVar51 | ((short)uVar42 >= sVar51) * uVar42;
  auVar24._2_2_ = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
  auVar24._4_2_ = (ushort)((short)uVar45 < sVar5) * sVar5 | ((short)uVar45 >= sVar5) * uVar45;
  auVar24._6_2_ = (ushort)((short)uVar46 < sVar7) * sVar7 | ((short)uVar46 >= sVar7) * uVar46;
  auVar24._8_2_ = (ushort)((short)uVar47 < sVar9) * sVar9 | ((short)uVar47 >= sVar9) * uVar47;
  auVar24._10_2_ = (ushort)((short)uVar48 < sVar11) * sVar11 | ((short)uVar48 >= sVar11) * uVar48;
  auVar24._12_2_ = (ushort)((short)uVar49 < sVar13) * sVar13 | ((short)uVar49 >= sVar13) * uVar49;
  auVar24._14_2_ = (ushort)((short)uVar50 < sVar15) * sVar15 | ((short)uVar50 >= sVar15) * uVar50;
  alVar41 = (__m128i)paddsw(auVar37,(undefined1  [16])*t80);
  qs[1] = alVar41;
  alVar41 = (__m128i)paddsw(auVar24,(undefined1  [16])*t80);
  ps[1] = alVar41;
  return;
}

Assistant:

static inline void highbd_filter4_dual_sse2(__m128i *p, __m128i *q, __m128i *ps,
                                            __m128i *qs, const __m128i *mask,
                                            const __m128i *th, int bd,
                                            __m128i *t80) {
  __m128i ps0 = _mm_subs_epi16(p[0], *t80);
  __m128i ps1 = _mm_subs_epi16(p[1], *t80);
  __m128i qs0 = _mm_subs_epi16(q[0], *t80);
  __m128i qs1 = _mm_subs_epi16(q[1], *t80);
  const __m128i one = _mm_set1_epi16(1);
  const __m128i pmax =
      _mm_subs_epi16(_mm_subs_epi16(_mm_slli_epi16(one, bd), one), *t80);

  const __m128i zero = _mm_setzero_si128();
  const __m128i pmin = _mm_subs_epi16(zero, *t80);
  __m128i filter = _mm_subs_epi16(ps1, qs1);
  pixel_clamp(&pmin, &pmax, &filter);

  // hev_filter
  __m128i hev;
  const __m128i abs_p1p0 = abs_diff16(p[1], p[0]);
  const __m128i abs_q1q0 = abs_diff16(q[1], q[0]);
  __m128i h = _mm_max_epi16(abs_p1p0, abs_q1q0);
  h = _mm_subs_epu16(h, *th);
  const __m128i ffff = _mm_cmpeq_epi16(h, h);
  hev = _mm_xor_si128(_mm_cmpeq_epi16(h, zero), ffff);

  filter = _mm_and_si128(filter, hev);

  const __m128i x = _mm_subs_epi16(qs0, ps0);
  filter = _mm_adds_epi16(filter, x);
  filter = _mm_adds_epi16(filter, x);
  filter = _mm_adds_epi16(filter, x);
  pixel_clamp(&pmin, &pmax, &filter);
  filter = _mm_and_si128(filter, *mask);
  const __m128i t3 = _mm_set1_epi16(3);
  const __m128i t4 = _mm_set1_epi16(4);
  __m128i filter1 = _mm_adds_epi16(filter, t4);
  __m128i filter2 = _mm_adds_epi16(filter, t3);
  pixel_clamp(&pmin, &pmax, &filter1);
  pixel_clamp(&pmin, &pmax, &filter2);
  filter1 = _mm_srai_epi16(filter1, 3);
  filter2 = _mm_srai_epi16(filter2, 3);
  qs0 = _mm_subs_epi16(qs0, filter1);
  pixel_clamp(&pmin, &pmax, &qs0);
  ps0 = _mm_adds_epi16(ps0, filter2);
  pixel_clamp(&pmin, &pmax, &ps0);
  qs[0] = _mm_adds_epi16(qs0, *t80);
  ps[0] = _mm_adds_epi16(ps0, *t80);
  filter = _mm_adds_epi16(filter1, one);
  filter = _mm_srai_epi16(filter, 1);
  filter = _mm_andnot_si128(hev, filter);
  qs1 = _mm_subs_epi16(qs1, filter);
  pixel_clamp(&pmin, &pmax, &qs1);
  ps1 = _mm_adds_epi16(ps1, filter);
  pixel_clamp(&pmin, &pmax, &ps1);
  qs[1] = _mm_adds_epi16(qs1, *t80);
  ps[1] = _mm_adds_epi16(ps1, *t80);
}